

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallSubdirectoryGenerator.cxx
# Opt level: O1

bool __thiscall cmInstallSubdirectoryGenerator::HaveInstall(cmInstallSubdirectoryGenerator *this)

{
  pointer puVar1;
  char cVar2;
  pointer puVar3;
  bool bVar4;
  
  puVar3 = (this->Makefile->InstallGenerators).
           super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->Makefile->InstallGenerators).
           super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = puVar3 != puVar1;
  if (bVar4) {
    cVar2 = (**(code **)((long)(((puVar3->_M_t).
                                 super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                                 .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl)->
                               super_cmScriptGenerator)._vptr_cmScriptGenerator + 0x40))();
    while (cVar2 == '\0') {
      puVar3 = puVar3 + 1;
      bVar4 = puVar3 != puVar1;
      if (puVar3 == puVar1) {
        return bVar4;
      }
      cVar2 = (**(code **)((long)(((puVar3->_M_t).
                                   super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                                   .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl)
                                 ->super_cmScriptGenerator)._vptr_cmScriptGenerator + 0x40))();
    }
  }
  return bVar4;
}

Assistant:

bool cmInstallSubdirectoryGenerator::HaveInstall()
{
  for (const auto& generator : this->Makefile->GetInstallGenerators()) {
    if (generator->HaveInstall()) {
      return true;
    }
  }

  return false;
}